

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvavucstart.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  uint local_40;
  int local_3c;
  int character;
  int y;
  uint32_t word;
  int i;
  FILE *payload;
  int start;
  int base;
  int cnum;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _cnum = argv;
  argv_local._0_4_ = argc;
  iVar2 = nva_init();
  if (iVar2 == 0) {
    start = 0;
    payload._4_4_ = 0;
    bVar1 = true;
    while (base = getopt((int)argv_local,_cnum,"c:bvu"), base != -1) {
      if (base == 0x62) {
        payload._4_4_ = 0xabcd;
      }
      else if (base == 99) {
        __isoc99_sscanf(_optarg,"%d",&start);
      }
      else if (base == 0x75) {
        bVar1 = false;
      }
    }
    if (start < nva_cardsnum) {
      if (payload._4_4_ == 0) {
        fprintf(_stderr,"No engine specified. Specify -b for PBSP, -v for PVP\n");
        argv_local._4_4_ = 1;
      }
      else if (_optind < (int)argv_local) {
        __stream = fopen(_cnum[_optind],"rb");
        if (__stream == (FILE *)0x0) {
          fprintf(_stderr,"Binary file %s could not be opened.\n",_cnum[_optind]);
          argv_local._4_4_ = 1;
        }
        else {
          fprintf(_stderr,"Uploading file %s.\n",_cnum[_optind]);
          vuc_hold(start,0);
          do {
            character = 0;
            local_40 = 0;
            local_3c = 0;
            while ((local_3c < 4 && (local_40 = fgetc(__stream), local_40 != 0xffffffff))) {
              character = (local_40 & 0xff) << ((byte)(local_3c << 3) & 0x1f) | character;
              local_3c = local_3c + 1;
            }
          } while ((local_3c != 0) &&
                  (host_xt_wr32(start,0xcffca300,character), local_40 != 0xffffffff));
          if (bVar1) {
            vuc_start(start,0);
          }
          argv_local._4_4_ = 0;
        }
      }
      else {
        fprintf(_stderr,"At least specify payload file.\n");
        argv_local._4_4_ = 1;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	int base =0;
	int start = 1;
	while ((c = getopt (argc, argv, "c:bvu")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'b':
			    base = 0xabcd;
				break;
			case 'u':
			    start = 0;
		}

	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (!base) {
		fprintf (stderr, "No engine specified. Specify -b for PBSP, -v for PVP\n");
		return 1;
	}
	
	if (optind >= argc) {
	    fprintf(stderr, "At least specify payload file.\n");
	    return 1;
	}

	FILE *payload = fopen(argv[optind], "rb");
    
    if (payload == NULL) {
        fprintf(stderr, "Binary file %s could not be opened.\n", argv[optind]);
        return 1;
    } else {
        fprintf(stderr, "Uploading file %s.\n", argv[optind]);
    }
    
    int i;

    vuc_hold(cnum, 0);

	for (i = 0; ; i += 4) {
	    uint32_t word = 0;
	    int y;
	    int character = 0;
	    for (y = 0; y < 4; y++) {
    		character = fgetc(payload);
    		if (character == EOF) {
    		    break;
    		}
    		word |= ((unsigned char)character) << (y * 8);
    	}
    	if (y == 0) {
    	    break;
    	}
    	host_xt_wr32(cnum, XTENSA_VUC_CODE_ACCESS, word);
   		if (character == EOF) {
   		    break;
   		}
	}
	if (start) {
    	vuc_start(cnum, 0);
    }
	return 0;
}